

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

void conncache_remove_bundle(conncache *connc,connectbundle *bundle)

{
  curl_hash_element *local_38;
  curl_hash_element *he;
  curl_hash_iterator iter;
  connectbundle *bundle_local;
  conncache *connc_local;
  
  if (connc != (conncache *)0x0) {
    iter.current_element = (curl_llist_element *)bundle;
    Curl_hash_start_iterate(&connc->hash,(curl_hash_iterator *)&he);
    local_38 = Curl_hash_next_element((curl_hash_iterator *)&he);
    while (local_38 != (curl_hash_element *)0x0) {
      if ((curl_llist_element *)local_38->ptr == iter.current_element) {
        Curl_hash_delete(&connc->hash,local_38->key,local_38->key_len);
        return;
      }
      local_38 = Curl_hash_next_element((curl_hash_iterator *)&he);
    }
  }
  return;
}

Assistant:

static void conncache_remove_bundle(struct conncache *connc,
                                    struct connectbundle *bundle)
{
  struct curl_hash_iterator iter;
  struct curl_hash_element *he;

  if(!connc)
    return;

  Curl_hash_start_iterate(&connc->hash, &iter);

  he = Curl_hash_next_element(&iter);
  while(he) {
    if(he->ptr == bundle) {
      /* The bundle is destroyed by the hash destructor function,
         free_bundle_hash_entry() */
      Curl_hash_delete(&connc->hash, he->key, he->key_len);
      return;
    }

    he = Curl_hash_next_element(&iter);
  }
}